

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void mondead_helper(monst *mtmp,int adtyp)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  obj *obj;
  int x;
  permonst *ppVar4;
  
  if (((mtmp->field_0x63 & 8) != 0) && (bVar1 = grddead(mtmp), bVar1 == '\0')) {
    return;
  }
  lifesaved_monster(mtmp,adtyp);
  if (0 < mtmp->mhp) {
    return;
  }
  if (u.usteed == mtmp) {
    dismount_steed(0);
  }
  obj = which_armor(mtmp,1);
  if ((((obj != (obj *)0x0) && ((ushort)(obj->otyp - 0x54U) < 0x16)) &&
      (obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr != (char *)0x0)) &&
     (iVar2 = strncmp(obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr,"gold ",5),
     iVar2 == 0)) {
    end_burn(obj,'\0');
  }
  bVar1 = does_block(level,(int)mtmp->mx,(int)mtmp->my,mtmp);
  if (bVar1 == '\0') {
    unblock_point((int)mtmp->mx,(int)mtmp->my);
  }
  uVar3 = *(uint *)&mtmp->field_0x60 >> 4 & 7;
  if (uVar3 == 0) {
    ppVar4 = mtmp->data;
    if (ppVar4 == mons + 0x11) {
      ppVar4 = mons + 0x10f;
      goto LAB_001ddbb8;
    }
    if (ppVar4 == mons + 0x17) {
      ppVar4 = mons + 0x110;
      goto LAB_001ddbb8;
    }
    if (ppVar4 == mons + 0x5d) {
      ppVar4 = mons + 0x10e;
      goto LAB_001ddbb8;
    }
  }
  else {
    ppVar4 = mons + cham_to_pm[uVar3];
LAB_001ddbb8:
    set_mon_data(mtmp,ppVar4,-1);
  }
  iVar2 = monsndx(mtmp->data);
  if (mvitals[iVar2].died != 0xff) {
    mvitals[iVar2].died = mvitals[iVar2].died + '\x01';
  }
  ppVar4 = mtmp->data;
  if ((ppVar4 == mons + 0x128 || ppVar4 == mons + 0xea) ||
     (ppVar4 == mons + 0x143 || ppVar4->msound == ' ')) {
    violated(9);
  }
  if (mtmp->m_id == quest_status.leader_m_id) {
    quest_status._2_1_ = quest_status._2_1_ | 0x10;
  }
  if (mtmp->data->mlet == '%') {
    iVar2 = rnd(5);
    if (iVar2 == 2) {
      ppVar4 = mtmp->data;
      x = 0;
      iVar2 = 0;
    }
    else {
      if (iVar2 != 1) goto LAB_001ddce1;
      ppVar4 = mtmp->data;
      x = (int)(level->dnstair).sx;
      iVar2 = (int)(level->dnstair).sy;
    }
    makemon(ppVar4,level,x,iVar2,0);
  }
LAB_001ddce1:
  if ((mtmp->field_0x63 & 0x20) != 0) {
    wizdead();
  }
  if (mtmp->data->msound == ' ') {
    nemdead();
  }
  ppVar4 = (permonst *)(long)mtmp->my;
  if ((level->locations[mtmp->mx][(long)ppVar4].field_0x6 & 8) != 0) {
    unmap_object((int)mtmp->mx,(int)mtmp->my);
  }
  m_detach(mtmp,ppVar4);
  return;
}

Assistant:

void mondead_helper(struct monst *mtmp, int adtyp)
{
	const struct permonst *mptr;
	int tmp;
	struct obj *otmp;

	if (mtmp->isgd) {
		/* if we're going to abort the death, it *must* be before
		 * the m_detach or there will be relmon problems later */
		if (!grddead(mtmp)) return;
	}
	lifesaved_monster(mtmp, adtyp);
	if (mtmp->mhp > 0) return;

	/* Player is thrown from his steed when it dies */
	if (mtmp == u.usteed)
		dismount_steed(DISMOUNT_GENERIC);

	/* extinguish monster's armor */
	if ((otmp = which_armor(mtmp, W_ARM)) && Is_gold_dragon_armor(otmp->otyp))
	    end_burn(otmp, FALSE);

	/* monster should no longer block vision */
	if (!does_block(level, mtmp->mx, mtmp->my, mtmp))
	    unblock_point(mtmp->mx, mtmp->my);

	mptr = mtmp->data;		/* save this for m_detach() */
	/* restore chameleon, lycanthropes to true form at death */
	if (mtmp->cham)
	    set_mon_data(mtmp, &mons[cham_to_pm[mtmp->cham]], -1);
	else if (mtmp->data == &mons[PM_WEREJACKAL])
	    set_mon_data(mtmp, &mons[PM_HUMAN_WEREJACKAL], -1);
	else if (mtmp->data == &mons[PM_WEREWOLF])
	    set_mon_data(mtmp, &mons[PM_HUMAN_WEREWOLF], -1);
	else if (mtmp->data == &mons[PM_WERERAT])
	    set_mon_data(mtmp, &mons[PM_HUMAN_WERERAT], -1);

	/* if MAXMONNO monsters of a given type have died, and it
	 * can be done, extinguish that monster.
	 *
	 * mvitals[].died does double duty as total number of dead monsters
	 * and as experience factor for the player killing more monsters.
	 * this means that a dragon dying by other means reduces the
	 * experience the player gets for killing a dragon directly; this
	 * is probably not too bad, since the player likely finagled the
	 * first dead dragon via ring of conflict or pets, and extinguishing
	 * based on only player kills probably opens more avenues of abuse
	 * for rings of conflict and such.
	 */
	tmp = monsndx(mtmp->data);
	if (mvitals[tmp].died < 255) mvitals[tmp].died++;

	/* killing an artifact-guardian is ordinary robbery */
	if (is_guardian(mtmp->data))
	    violated(CONDUCT_THIEVERY);

	/* if it's a (possibly polymorphed) quest leader, mark him as dead */
	if (mtmp->m_id == quest_status.leader_m_id)
	    quest_status.leader_is_dead = TRUE;

	if (mtmp->data->mlet == S_KOP) {
	    /* Dead Kops may come back. */
	    switch(rnd(5)) {
		case 1:	     /* returns near the stairs */
			makemon(mtmp->data, level, level->dnstair.sx, level->dnstair.sy, NO_MM_FLAGS);
			break;
		case 2:	     /* randomly */
			makemon(mtmp->data, level, 0, 0, NO_MM_FLAGS);
			break;
		default:
			break;
	    }
	}

	if (mtmp->iswiz) wizdead();
	if (mtmp->data->msound == MS_NEMESIS) nemdead();
	if (level->locations[mtmp->mx][mtmp->my].mem_invis)
	    unmap_object(mtmp->mx, mtmp->my);
	m_detach(mtmp, mptr);
}